

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::post_status(torrent *this,status_flags_t flags)

{
  int iVar1;
  undefined4 extraout_var;
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> s;
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> local_28;
  
  local_28.
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>.
  _M_impl.super__Vector_impl_data._M_start = (torrent_status *)0x0;
  local_28.
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::resize
            (&local_28,1);
  status(this,local_28.
              super__Vector_base<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>
              ._M_impl.super__Vector_impl_data._M_start,flags);
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  alert_manager::
  emplace_alert<libtorrent::state_update_alert,std::vector<libtorrent::torrent_status,std::allocator<libtorrent::torrent_status>>>
            ((alert_manager *)CONCAT44(extraout_var,iVar1),&local_28);
  ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::~vector
            (&local_28);
  return;
}

Assistant:

void torrent::post_status(status_flags_t const flags)
	{
		std::vector<torrent_status> s;
		s.resize(1);
		status(&s.front(), flags);
		m_ses.alerts().emplace_alert<state_update_alert>(std::move(s));
	}